

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall
flexbuffers::Verifier::VerifyVector(Verifier *this,Reference r,uint8_t *p,Type elem_type)

{
  uint8_t uVar1;
  bool bVar2;
  BitWidth bit_width;
  reference pvVar3;
  size_t len;
  Reference r_00;
  byte local_ea;
  bool local_d9;
  size_t local_c8;
  size_t i_1;
  TypedVector v_1;
  size_t local_90;
  size_t i;
  Vector v;
  size_t byte_size;
  unsigned_long max_elems;
  uint8_t elem_byte_width;
  size_t num_elems;
  Sized sized;
  value_type existing;
  uint8_t packed_type;
  uint8_t size_byte_width;
  Type elem_type_local;
  uint8_t *p_local;
  Verifier *this_local;
  Reference r_local;
  
  this->depth_ = this->depth_ + 1;
  this->num_vectors_ = this->num_vectors_ + 1;
  local_d9 = false;
  if (this->depth_ <= this->max_depth_) {
    local_d9 = this->num_vectors_ <= this->max_vectors_;
  }
  sized.size_._4_4_ = elem_type;
  bVar2 = Check(this,local_d9);
  if (bVar2) {
    r_local.data_._1_1_ = r.byte_width_;
    sized.size_._3_1_ = r_local.data_._1_1_;
    bVar2 = VerifyBeforePointer(this,p,(ulong)r_local.data_._1_1_);
    if (bVar2) {
      r_local.data_._4_4_ = r.type_;
      if (this->reuse_tracker_ != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        bit_width = Builder::WidthB((ulong)sized.size_._3_1_);
        sized.size_._2_1_ = PackedType(bit_width,r_local.data_._4_4_);
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (this->reuse_tracker_,
                            (size_type_conflict)
                            (p + (-(long)this->buf_ - (long)(int)(uint)sized.size_._3_1_)));
        sized.size_._1_1_ = *pvVar3;
        if (sized.size_._1_1_ == sized.size_._2_1_) {
          return true;
        }
        bVar2 = Check(this,sized.size_._1_1_ == '\0');
        uVar1 = sized.size_._2_1_;
        if (!bVar2) {
          return false;
        }
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (this->reuse_tracker_,
                            (size_type_conflict)
                            (p + (-(long)this->buf_ - (long)(int)(uint)sized.size_._3_1_)));
        *pvVar3 = uVar1;
      }
      Sized::Sized((Sized *)&num_elems,p,sized.size_._3_1_);
      len = Sized::size((Sized *)&num_elems);
      if ((r_local.data_._4_4_ == FBT_STRING) || (r_local.data_._4_4_ == FBT_BLOB)) {
        local_ea = 1;
      }
      else {
        local_ea = r_local.data_._1_1_;
      }
      bVar2 = Check(this,len < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) /
                                      ZEXT116(local_ea),0));
      if (bVar2) {
        v.super_Sized.size_ = len * local_ea;
        bVar2 = VerifyFromPointer(this,p,v.super_Sized.size_);
        if (bVar2) {
          if (sized.size_._4_4_ == FBT_NULL) {
            bVar2 = VerifyFromPointer(this,p + v.super_Sized.size_,len);
            if (!bVar2) {
              return false;
            }
            Vector::Vector((Vector *)&i,p,sized.size_._3_1_);
            for (local_90 = 0; local_90 < len; local_90 = local_90 + 1) {
              join_0x00000010_0x00000000_ = Vector::operator[]((Vector *)&i,local_90);
              bVar2 = VerifyRef(this,join_0x00000010_0x00000000_);
              if (!bVar2) {
                return false;
              }
            }
          }
          else if (sized.size_._4_4_ == FBT_KEY) {
            TypedVector::TypedVector((TypedVector *)&i_1,p,local_ea,FBT_KEY);
            for (local_c8 = 0; local_c8 < len; local_c8 = local_c8 + 1) {
              r_00 = TypedVector::operator[]((TypedVector *)&i_1,local_c8);
              bVar2 = VerifyRef(this,r_00);
              if (!bVar2) {
                return false;
              }
            }
          }
          else {
            bVar2 = IsInline(sized.size_._4_4_);
            if (!bVar2) {
              __assert_fail("IsInline(elem_type)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                            ,0x71e,
                            "bool flexbuffers::Verifier::VerifyVector(Reference, const uint8_t *, Type)"
                           );
            }
          }
          this->depth_ = this->depth_ - 1;
          r_local.type_._3_1_ = 1;
        }
        else {
          r_local.type_._3_1_ = FBT_NULL >> 0x18;
        }
      }
      else {
        r_local.type_._3_1_ = FBT_NULL >> 0x18;
      }
    }
    else {
      r_local.type_._3_1_ = FBT_NULL >> 0x18;
    }
  }
  else {
    r_local.type_._3_1_ = FBT_NULL >> 0x18;
  }
  return (bool)r_local.type_._3_1_;
}

Assistant:

bool VerifyVector(Reference r, const uint8_t *p, Type elem_type) {
    // Any kind of nesting goes thru this function, so guard against that
    // here, both with simple nesting checks, and the reuse tracker if on.
    depth_++;
    num_vectors_++;
    if (!Check(depth_ <= max_depth_ && num_vectors_ <= max_vectors_))
      return false;
    auto size_byte_width = r.byte_width_;
    if (!VerifyBeforePointer(p, size_byte_width)) return false;
    FLEX_CHECK_VERIFIED(p - size_byte_width,
                        PackedType(Builder::WidthB(size_byte_width), r.type_));
    auto sized = Sized(p, size_byte_width);
    auto num_elems = sized.size();
    auto elem_byte_width = r.type_ == FBT_STRING || r.type_ == FBT_BLOB
                               ? uint8_t(1)
                               : r.byte_width_;
    auto max_elems = SIZE_MAX / elem_byte_width;
    if (!Check(num_elems < max_elems))
      return false;  // Protect against byte_size overflowing.
    auto byte_size = num_elems * elem_byte_width;
    if (!VerifyFromPointer(p, byte_size)) return false;
    if (elem_type == FBT_NULL) {
      // Verify type bytes after the vector.
      if (!VerifyFromPointer(p + byte_size, num_elems)) return false;
      auto v = Vector(p, size_byte_width);
      for (size_t i = 0; i < num_elems; i++)
        if (!VerifyRef(v[i])) return false;
    } else if (elem_type == FBT_KEY) {
      auto v = TypedVector(p, elem_byte_width, FBT_KEY);
      for (size_t i = 0; i < num_elems; i++)
        if (!VerifyRef(v[i])) return false;
    } else {
      FLATBUFFERS_ASSERT(IsInline(elem_type));
    }
    depth_--;
    return true;
  }